

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O2

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  uint uVar1;
  double *__ptr;
  long lVar2;
  ulong uVar3;
  
  free_string_field(&args_info->output_arg);
  free_string_field(&args_info->output_orig);
  free_string_field(&args_info->density_orig);
  free_string_field(&args_info->nx_orig);
  free_string_field(&args_info->ny_orig);
  free_string_field(&args_info->nz_orig);
  __ptr = args_info->molFraction_arg;
  if (__ptr != (double *)0x0) {
    uVar1 = args_info->molFraction_given;
    for (lVar2 = 0; (ulong)uVar1 << 3 != lVar2; lVar2 = lVar2 + 8) {
      free_string_field((char **)((long)args_info->molFraction_orig + lVar2));
    }
    free(__ptr);
    free(args_info->molFraction_orig);
    args_info->molFraction_orig = (char **)0x0;
  }
  args_info->molFraction_arg = (double *)0x0;
  free_string_field(&args_info->lattice_arg);
  free_string_field(&args_info->lattice_orig);
  for (uVar3 = 0; uVar3 < args_info->inputs_num; uVar3 = uVar3 + 1) {
    free(args_info->inputs[uVar3]);
  }
  if (args_info->inputs_num != 0) {
    free(args_info->inputs);
  }
  args_info->nx_given = 0;
  args_info->ny_given = 0;
  args_info->nz_given = 0;
  args_info->molFraction_given = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->output_given = 0;
  args_info->density_given = 0;
  args_info->lattice_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->density_orig));
  free_string_field (&(args_info->nx_orig));
  free_string_field (&(args_info->ny_orig));
  free_string_field (&(args_info->nz_orig));
  free_multiple_field (args_info->molFraction_given, (void *)(args_info->molFraction_arg), &(args_info->molFraction_orig));
  args_info->molFraction_arg = 0;
  free_string_field (&(args_info->lattice_arg));
  free_string_field (&(args_info->lattice_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}